

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O1

void __thiscall
SIPrefix_Correctness_Test::~SIPrefix_Correctness_Test(SIPrefix_Correctness_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SIPrefix, Correctness)
{
    using namespace units;
    EXPECT_EQ(convert(precise::kilo, one), 1000.0);
    EXPECT_EQ(convert(precise::milli, one), 0.001);
    EXPECT_EQ(convert(precise::mega, count), 1e6);
    EXPECT_EQ(convert(precise::micro, count), 1e-6);
    EXPECT_EQ(convert(precise::nano, count), 1e-9);
    EXPECT_EQ(convert(precise::pico, one), 1e-12);
    EXPECT_EQ(convert(precise::femto, one), 1e-15);
    EXPECT_EQ(convert(precise::atto, one), 1e-18);
    EXPECT_NEAR(convert(one, precise::nano), 1e9, test::tolerance);
    EXPECT_EQ(convert(one, precise::giga), 1e-9);
    EXPECT_EQ(convert(precise::giga, one), 1e9);
    EXPECT_EQ(convert(precise::tera, one), 1e12);
    EXPECT_EQ(convert(precise::peta, one), 1e15);
    EXPECT_EQ(convert(precise::exa, one), 1e18);
}